

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  long *plVar1;
  ulong *puVar2;
  ulong *puVar3;
  int *piVar4;
  uint8_t *puVar5;
  LZ4_stream_t_internal *__src;
  int iVar6;
  char cVar7;
  int iVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  char cVar12;
  uint uVar13;
  long *plVar14;
  ulong uVar15;
  ulong *puVar16;
  long lVar17;
  ulong *puVar18;
  ulong *puVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong *puVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  ulong *puVar27;
  ulong *puVar28;
  ushort uVar29;
  int *piVar30;
  int *piVar31;
  long *plVar32;
  long lVar33;
  long lVar34;
  char *pcVar35;
  ulong *puVar36;
  ulong *puVar37;
  int *piVar38;
  char *pcVar39;
  long lVar40;
  BYTE *s;
  int iVar41;
  BYTE *e;
  long *plVar42;
  int iVar43;
  BYTE *s_2;
  uint uVar44;
  BYTE *e_3;
  U32 *hashTable;
  char *local_e8;
  char *local_e0;
  U32 *hashTable_20;
  int local_98;
  int local_88;
  
  if ((LZ4_stream->internal_donotuse).dirty != 0) {
    return 0;
  }
  uVar26 = (LZ4_stream->internal_donotuse).dictSize;
  puVar5 = (LZ4_stream->internal_donotuse).dictionary;
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  iVar41 = 1;
  if (1 < acceleration) {
    iVar41 = acceleration;
  }
  uVar10 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (puVar5 + uVar26 == (uint8_t *)source ||
      (LZ4_stream->internal_donotuse).dictSize - 4 < 0xfffffffd) {
    piVar9 = (int *)(puVar5 + uVar26);
    piVar31 = (int *)(LZ4_stream->internal_donotuse).dictionary;
  }
  else {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
    uVar10 = 0;
    piVar9 = (int *)source;
    piVar31 = (int *)source;
  }
  piVar4 = (int *)(source + inputSize);
  if ((piVar31 < piVar4) && (piVar4 < piVar9)) {
    local_88 = (int)piVar4;
    uVar13 = (int)piVar9 - local_88;
    uVar26 = 0x10000;
    if (uVar13 < 0x10000) {
      uVar26 = uVar13;
    }
    uVar10 = 0;
    if (3 < uVar13) {
      uVar10 = (ulong)uVar26;
    }
    (LZ4_stream->internal_donotuse).dictSize = (uint32_t)uVar10;
    piVar31 = (int *)((long)piVar9 - uVar10);
    (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)piVar31;
  }
  uVar26 = (uint)uVar10;
  local_98 = (int)dest;
  if (piVar9 == (int *)source) {
    uVar13 = (LZ4_stream->internal_donotuse).currentOffset;
    lVar24 = (long)source - (ulong)uVar13;
    iVar21 = (int)lVar24;
    pcVar35 = dest;
    if (uVar26 < uVar13 && uVar26 < 0x10000) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      (LZ4_stream->internal_donotuse).dictSize = uVar26 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar13 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        plVar1 = (long *)((long)piVar4 - 0xb);
        piVar9 = (int *)(source + -uVar10);
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar13;
        plVar14 = (long *)(source + 2);
        puVar28 = (ulong *)(piVar4 + -3);
LAB_00106484:
        lVar40 = *(long *)((long)source + 1);
        plVar32 = (long *)((long)source + 1);
        iVar20 = iVar41 << 6;
        while( true ) {
          plVar42 = plVar14;
          uVar10 = (ulong)(lVar40 * -0x30e4432345000000) >> 0x34;
          uVar25 = *(uint *)((long)LZ4_stream + uVar10 * 4);
          iVar8 = (int)plVar32;
          lVar40 = *plVar42;
          *(int *)((long)LZ4_stream + uVar10 * 4) = iVar8 - iVar21;
          if (((uVar13 - uVar26 <= uVar25) && ((uint)(iVar8 - iVar21) <= uVar25 + 0xffff)) &&
             (*(int *)(lVar24 + (ulong)uVar25) == (int)*plVar32)) break;
          plVar14 = (long *)((long)(iVar20 >> 6) + (long)plVar42);
          iVar20 = iVar20 + 1;
          plVar32 = plVar42;
          if (plVar1 < plVar14) goto LAB_001079e6;
        }
        lVar17 = (ulong)uVar25 + lVar24;
        uVar22 = iVar8 - (int)source;
        lVar40 = 0;
        uVar25 = uVar22 - 0xf;
        cVar7 = (char)plVar32 * '\x10' + (char)source * -0x10;
        do {
          cVar12 = cVar7;
          uVar44 = uVar25;
          lVar34 = lVar40;
          piVar31 = (int *)(lVar17 + lVar34);
          plVar14 = (long *)((long)plVar32 + lVar34);
          if ((piVar31 <= piVar9) || (plVar14 <= source)) break;
          lVar40 = lVar34 + -1;
          uVar25 = uVar44 - 1;
          cVar7 = cVar12 + -0x10;
        } while (*(char *)((long)plVar32 + lVar34 + -1) == *(char *)(lVar17 + -1 + lVar34));
        iVar20 = (int)lVar34;
        uVar10 = (ulong)(uint)((iVar8 - (int)source) + iVar20);
        if (dest + maxOutputSize <
            pcVar35 + ((ulong)uVar22 + lVar34 & 0xffffffff) / 0xff + uVar10 + 9) {
          return 0;
        }
        plVar32 = (long *)(pcVar35 + 1);
        if ((uint)((ulong)uVar22 + lVar34) < 0xf) {
          *pcVar35 = cVar12;
        }
        else {
          uVar15 = (ulong)(uVar22 - 0xf) + lVar34;
          *pcVar35 = -0x10;
          if (0xfe < (int)uVar15) {
            uVar25 = 0x1fd;
            if (uVar44 < 0x1fd) {
              uVar25 = uVar44;
            }
            if (0x1fc < (int)uVar44) {
              uVar44 = 0x1fd;
            }
            memset(plVar32,0xff,(ulong)((((uVar22 + 0xef) - uVar25) + iVar20) / 0xff + 1));
            uVar25 = ((uVar22 + 0xef) - uVar44) + iVar20;
            plVar32 = (long *)(pcVar35 + (ulong)uVar25 / 0xff + 2);
            uVar15 = (ulong)((uVar22 - 0x10e) + iVar20 + (uVar25 % 0xff - uVar25));
          }
          *(char *)plVar32 = (char)uVar15;
          plVar32 = (long *)((long)plVar32 + 1);
        }
        plVar42 = (long *)(uVar10 + (long)plVar32);
        do {
          *plVar32 = *(long *)source;
          plVar32 = plVar32 + 1;
          source = (char *)((long)source + 8);
        } while (plVar32 < plVar42);
        do {
          *(short *)plVar42 = (short)plVar14 - (short)piVar31;
          puVar3 = (ulong *)((long)plVar14 + 4);
          puVar23 = (ulong *)(piVar31 + 1);
          puVar27 = puVar3;
          if (puVar3 < puVar28) {
            if (*puVar23 == *puVar3) {
              puVar23 = (ulong *)(piVar31 + 3);
              puVar27 = (ulong *)((long)plVar14 + 0xc);
              goto LAB_00106696;
            }
            uVar10 = *puVar3 ^ *puVar23;
            lVar40 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            uVar25 = (uint)lVar40 >> 3;
          }
          else {
LAB_00106696:
            if (puVar27 < puVar28) {
              iVar20 = ((int)puVar27 - (int)plVar14) + -4;
LAB_001066a3:
              if (*puVar23 == *puVar27) goto code_r0x001066ae;
              uVar15 = *puVar27 ^ *puVar23;
              uVar10 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar25 = ((uint)(uVar10 >> 3) & 0x1fffffff) + iVar20;
              goto LAB_00106724;
            }
LAB_001066be:
            if ((puVar27 < piVar4 + -2) && ((int)*puVar23 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar27 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar23 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar27 < (ulong *)((long)piVar4 - 5U)) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar23 == (char)*puVar27));
            }
            uVar25 = (int)puVar27 - (int)puVar3;
          }
LAB_00106724:
          if (dest + maxOutputSize < (char *)((long)plVar42 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          pcVar39 = (char *)((long)plVar42 + 2);
          if (uVar25 < 0xf) {
            *pcVar35 = *pcVar35 + (char)uVar25;
            pcVar35 = pcVar39;
          }
          else {
            *pcVar35 = *pcVar35 + '\x0f';
            uVar29 = (ushort)(uVar25 - 0xf);
            pcVar39[0] = -1;
            pcVar39[1] = -1;
            pcVar39[2] = -1;
            pcVar39[3] = -1;
            if (0x3fb < uVar25 - 0xf) {
              uVar29 = (ushort)((ulong)(uVar25 - 0x40b) % 0x3fc);
              uVar10 = (ulong)((uVar25 - 0x40b) / 0x3fc << 2);
              memset((char *)((long)plVar42 + 6),0xff,uVar10 + 4);
              pcVar39 = (char *)((long)plVar42 + uVar10 + 6);
            }
            pcVar39[uVar29 / 0xff] = (char)(uVar29 % 0xff);
            pcVar35 = pcVar39 + uVar29 / 0xff + 1;
          }
          lVar40 = (long)plVar14 + (ulong)uVar25;
          source = (char *)(lVar40 + 4);
          if (plVar1 <= source) break;
          *(int *)((long)LZ4_stream +
                  ((ulong)(*(long *)(lVar40 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
               ((int)lVar40 + 2) - iVar21;
          uVar10 = (ulong)(*(long *)source * -0x30e4432345000000) >> 0x34;
          uVar22 = (int)source - iVar21;
          uVar25 = *(uint *)((long)LZ4_stream + uVar10 * 4);
          *(uint *)((long)LZ4_stream + uVar10 * 4) = uVar22;
          if (((uVar25 < uVar13 - uVar26) || (uVar25 + 0xffff < uVar22)) ||
             (piVar31 = (int *)((ulong)uVar25 + lVar24), *piVar31 != *(int *)source))
          goto LAB_00106856;
          plVar42 = (long *)(pcVar35 + 1);
          *pcVar35 = '\0';
          plVar14 = (long *)source;
        } while( true );
      }
    }
    else {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      (LZ4_stream->internal_donotuse).dictSize = uVar26 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar13 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        plVar1 = (long *)((long)piVar4 - 0xb);
        piVar9 = (int *)(source + -uVar10);
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar13;
        plVar14 = (long *)(source + 2);
        puVar28 = (ulong *)(piVar4 + -3);
LAB_001083c5:
        lVar40 = *(long *)((long)source + 1);
        plVar32 = (long *)((long)source + 1);
        iVar20 = iVar41 << 6;
        while( true ) {
          uVar10 = (ulong)(lVar40 * -0x30e4432345000000) >> 0x34;
          uVar26 = *(uint *)((long)LZ4_stream + uVar10 * 4);
          iVar8 = (int)plVar32;
          lVar40 = *plVar14;
          *(int *)((long)LZ4_stream + uVar10 * 4) = iVar8 - iVar21;
          if (((uint)(iVar8 - iVar21) <= uVar26 + 0xffff) &&
             (*(int *)(lVar24 + (ulong)uVar26) == (int)*plVar32)) break;
          plVar42 = (long *)((long)(iVar20 >> 6) + (long)plVar14);
          iVar20 = iVar20 + 1;
          plVar32 = plVar14;
          plVar14 = plVar42;
          if (plVar1 < plVar42) goto LAB_001079e6;
        }
        lVar17 = (ulong)uVar26 + lVar24;
        uVar13 = iVar8 - (int)source;
        lVar40 = 0;
        uVar26 = uVar13 - 0xf;
        cVar7 = (char)plVar32 * '\x10' + (char)source * -0x10;
        do {
          cVar12 = cVar7;
          uVar25 = uVar26;
          lVar34 = lVar40;
          piVar31 = (int *)(lVar17 + lVar34);
          plVar14 = (long *)((long)plVar32 + lVar34);
          if ((piVar31 <= piVar9) || (plVar14 <= source)) break;
          lVar40 = lVar34 + -1;
          uVar26 = uVar25 - 1;
          cVar7 = cVar12 + -0x10;
        } while (*(char *)((long)plVar32 + lVar34 + -1) == *(char *)(lVar17 + -1 + lVar34));
        iVar20 = (int)lVar34;
        uVar10 = (ulong)(uint)((iVar8 - (int)source) + iVar20);
        if (dest + maxOutputSize <
            pcVar35 + ((ulong)uVar13 + lVar34 & 0xffffffff) / 0xff + uVar10 + 9) {
          return 0;
        }
        plVar32 = (long *)(pcVar35 + 1);
        if ((uint)((ulong)uVar13 + lVar34) < 0xf) {
          *pcVar35 = cVar12;
        }
        else {
          uVar15 = (ulong)(uVar13 - 0xf) + lVar34;
          *pcVar35 = -0x10;
          if (0xfe < (int)uVar15) {
            uVar26 = 0x1fd;
            if (uVar25 < 0x1fd) {
              uVar26 = uVar25;
            }
            if (0x1fc < (int)uVar25) {
              uVar25 = 0x1fd;
            }
            memset(plVar32,0xff,(ulong)((((uVar13 + 0xef) - uVar26) + iVar20) / 0xff + 1));
            uVar26 = ((uVar13 + 0xef) - uVar25) + iVar20;
            plVar32 = (long *)(pcVar35 + (ulong)uVar26 / 0xff + 2);
            uVar15 = (ulong)((uVar13 - 0x10e) + iVar20 + (uVar26 % 0xff - uVar26));
          }
          *(char *)plVar32 = (char)uVar15;
          plVar32 = (long *)((long)plVar32 + 1);
        }
        plVar42 = (long *)(uVar10 + (long)plVar32);
        do {
          *plVar32 = *(long *)source;
          plVar32 = plVar32 + 1;
          source = (char *)((long)source + 8);
        } while (plVar32 < plVar42);
        do {
          *(short *)plVar42 = (short)plVar14 - (short)piVar31;
          puVar3 = (ulong *)((long)plVar14 + 4);
          puVar23 = (ulong *)(piVar31 + 1);
          puVar27 = puVar3;
          if (puVar3 < puVar28) {
            if (*puVar23 == *puVar3) {
              puVar23 = (ulong *)(piVar31 + 3);
              puVar27 = (ulong *)((long)plVar14 + 0xc);
              goto LAB_001085c5;
            }
            uVar10 = *puVar3 ^ *puVar23;
            lVar40 = 0;
            if (uVar10 != 0) {
              for (; (uVar10 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            uVar26 = (uint)lVar40 >> 3;
          }
          else {
LAB_001085c5:
            if (puVar27 < puVar28) {
              iVar20 = ((int)puVar27 - (int)plVar14) + -4;
LAB_001085d2:
              if (*puVar23 == *puVar27) goto code_r0x001085dd;
              uVar15 = *puVar27 ^ *puVar23;
              uVar10 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar26 = ((uint)(uVar10 >> 3) & 0x1fffffff) + iVar20;
              goto LAB_00108656;
            }
LAB_001085ed:
            if ((puVar27 < piVar4 + -2) && ((int)*puVar23 == (int)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 4);
              puVar23 = (ulong *)((long)puVar23 + 4);
            }
            if ((puVar27 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar23 == (short)*puVar27)) {
              puVar27 = (ulong *)((long)puVar27 + 2);
              puVar23 = (ulong *)((long)puVar23 + 2);
            }
            if (puVar27 < (ulong *)((long)piVar4 - 5U)) {
              puVar27 = (ulong *)((long)puVar27 + (ulong)((char)*puVar23 == (char)*puVar27));
            }
            uVar26 = (int)puVar27 - (int)puVar3;
          }
LAB_00108656:
          if (dest + maxOutputSize < (char *)((long)plVar42 + (ulong)(uVar26 + 0xf0) / 0xff + 8)) {
            return 0;
          }
          pcVar39 = (char *)((long)plVar42 + 2);
          if (uVar26 < 0xf) {
            *pcVar35 = *pcVar35 + (char)uVar26;
            pcVar35 = pcVar39;
          }
          else {
            *pcVar35 = *pcVar35 + '\x0f';
            uVar29 = (ushort)(uVar26 - 0xf);
            pcVar39[0] = -1;
            pcVar39[1] = -1;
            pcVar39[2] = -1;
            pcVar39[3] = -1;
            if (0x3fb < uVar26 - 0xf) {
              uVar29 = (ushort)((ulong)(uVar26 - 0x40b) % 0x3fc);
              uVar10 = (ulong)((uVar26 - 0x40b) / 0x3fc << 2);
              memset((char *)((long)plVar42 + 6),0xff,uVar10 + 4);
              pcVar39 = (char *)((long)plVar42 + uVar10 + 6);
            }
            pcVar39[uVar29 / 0xff] = (char)(uVar29 % 0xff);
            pcVar35 = pcVar39 + uVar29 / 0xff + 1;
          }
          lVar40 = (long)plVar14 + (ulong)uVar26;
          source = (char *)(lVar40 + 4);
          if (plVar1 <= source) break;
          *(int *)((long)LZ4_stream +
                  ((ulong)(*(long *)(lVar40 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
               ((int)lVar40 + 2) - iVar21;
          uVar10 = (ulong)(*(long *)source * -0x30e4432345000000) >> 0x34;
          uVar13 = (int)source - iVar21;
          uVar26 = *(uint *)((long)LZ4_stream + uVar10 * 4);
          *(uint *)((long)LZ4_stream + uVar10 * 4) = uVar13;
          if ((uVar26 + 0xffff < uVar13) ||
             (piVar31 = (int *)((ulong)uVar26 + lVar24), *piVar31 != *(int *)source))
          goto LAB_0010877a;
          plVar42 = (long *)(pcVar35 + 1);
          *pcVar35 = '\0';
          plVar14 = (long *)source;
        } while( true );
      }
    }
LAB_001079e6:
    uVar10 = (long)piVar4 - (long)source;
    if (dest + maxOutputSize < pcVar35 + (uVar10 + 0xf0) / 0xff + uVar10 + 1) {
      return 0;
    }
    if (uVar10 < 0xf) {
      *pcVar35 = (char)uVar10 << 4;
    }
    else {
      uVar15 = uVar10 - 0xf;
      *pcVar35 = -0x10;
      pcVar39 = pcVar35 + 1;
      if (0xfe < uVar15) {
        uVar11 = (uVar10 - 0x10e) / 0xff;
        memset(pcVar39,0xff,uVar11 + 1);
        uVar15 = (uVar11 * -0xff + uVar10) - 0x10e;
        pcVar39 = pcVar35 + uVar11 + 2;
      }
      *pcVar39 = (char)uVar15;
      pcVar35 = pcVar39;
    }
    memcpy(pcVar35 + 1,source,uVar10);
    return ((int)(pcVar35 + 1) + (int)uVar10) - local_98;
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  puVar28 = (ulong *)source;
  if (__src == (LZ4_stream_t_internal *)0x0) {
    uVar13 = (LZ4_stream->internal_donotuse).currentOffset;
    lVar40 = (long)source - (ulong)uVar13;
    lVar24 = -(ulong)uVar13;
    iVar21 = (int)lVar40;
    local_e8 = dest;
    if (uVar26 < uVar13 && uVar26 < 0x10000) {
      if ((uint)inputSize < 0x7e000001) {
        pcVar35 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar26 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar13 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        if (0xc < (uint)inputSize) {
          puVar3 = (ulong *)((long)piVar4 - 0xb);
          puVar23 = (ulong *)((long)piVar4 - 5);
          lVar24 = (long)piVar31 + lVar24 + uVar10;
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar13;
          puVar27 = (ulong *)(source + 2);
          puVar36 = (ulong *)(source + 1);
          uVar25 = uVar13 + 1;
          puVar2 = (ulong *)(piVar4 + -3);
LAB_001069a7:
          uVar15 = *(ulong *)((long)puVar28 + 1);
          iVar20 = iVar41 << 6;
          do {
            uVar11 = uVar15 * -0x30e4432345000000 >> 0x34;
            uVar22 = *(uint *)((long)LZ4_stream + uVar11 * 4);
            uVar15 = *puVar27;
            *(uint *)((long)LZ4_stream + uVar11 * 4) = uVar25;
            if ((uVar13 - uVar26 <= uVar22) && (uVar25 <= uVar22 + 0xffff)) {
              lVar17 = lVar24;
              if (uVar13 <= uVar22) {
                lVar17 = lVar40;
              }
              if (*(int *)(lVar17 + (ulong)uVar22) == (int)*puVar36) goto LAB_00106a12;
            }
            uVar25 = (int)puVar27 - iVar21;
            puVar16 = (ulong *)((long)(iVar20 >> 6) + (long)puVar27);
            iVar20 = iVar20 + 1;
            puVar36 = puVar27;
            puVar27 = puVar16;
            dest = local_e8;
            if (puVar3 < puVar16) break;
          } while( true );
        }
LAB_0010913e:
        uVar10 = (long)piVar4 - (long)puVar28;
        iVar43 = 0;
        if (pcVar35 < dest + (uVar10 + 0xf0) / 0xff + uVar10 + 1) goto LAB_00109212;
        if (0xe < uVar10) {
          *dest = -0x10;
          pcVar35 = dest;
          goto joined_r0x00109193;
        }
        *dest = (char)uVar10 << 4;
        goto LAB_001091e9;
      }
    }
    else if ((uint)inputSize < 0x7e000001) {
      pcVar35 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar26 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar13 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        puVar3 = (ulong *)((long)piVar4 - 0xb);
        puVar23 = (ulong *)((long)piVar4 - 5);
        lVar24 = (long)piVar31 + lVar24 + uVar10;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar13;
        puVar27 = (ulong *)(source + 2);
        puVar36 = (ulong *)(source + 1);
        uVar26 = uVar13 + 1;
        puVar2 = (ulong *)(piVar4 + -3);
LAB_00108870:
        uVar15 = *(ulong *)((long)puVar28 + 1);
        iVar20 = iVar41 << 6;
        do {
          uVar11 = uVar15 * -0x30e4432345000000 >> 0x34;
          uVar25 = *(uint *)((long)LZ4_stream + uVar11 * 4);
          uVar15 = *puVar27;
          *(uint *)((long)LZ4_stream + uVar11 * 4) = uVar26;
          if (uVar26 <= uVar25 + 0xffff) {
            lVar17 = lVar24;
            if (uVar13 <= uVar25) {
              lVar17 = lVar40;
            }
            if (*(int *)(lVar17 + (ulong)uVar25) == (int)*puVar36) goto LAB_001088d5;
          }
          uVar26 = (int)puVar27 - iVar21;
          puVar16 = (ulong *)((long)(iVar20 >> 6) + (long)puVar27);
          iVar20 = iVar20 + 1;
          puVar36 = puVar27;
          puVar27 = puVar16;
          dest = local_e8;
          if (puVar3 < puVar16) break;
        } while( true );
      }
LAB_001082aa:
      uVar10 = (long)piVar4 - (long)puVar28;
      iVar43 = 0;
      if (pcVar35 < dest + (uVar10 + 0xf0) / 0xff + uVar10 + 1) goto LAB_00109212;
      if (uVar10 < 0xf) {
        *dest = (char)uVar10 << 4;
      }
      else {
        uVar15 = uVar10 - 0xf;
        *dest = -0x10;
        pcVar35 = dest + 1;
        if (0xfe < uVar15) {
          uVar11 = (uVar10 - 0x10e) / 0xff;
          memset(pcVar35,0xff,uVar11 + 1);
          uVar15 = (uVar11 * -0xff + uVar10) - 0x10e;
          pcVar35 = dest + uVar11 + 2;
        }
        *pcVar35 = (char)uVar15;
        dest = pcVar35;
      }
      goto LAB_00109075;
    }
LAB_00107a9f:
    iVar43 = 0;
  }
  else {
    if (0x1000 < inputSize) {
      memcpy(LZ4_stream,__src,0x4020);
      if ((uint)inputSize < 0x7e000001) {
        uVar26 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar40 = (long)source - (ulong)uVar26;
        piVar9 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        uVar13 = (LZ4_stream->internal_donotuse).dictSize;
        puVar3 = (ulong *)((long)piVar4 - 0xb);
        puVar23 = (ulong *)((long)piVar4 - 5);
        lVar24 = (long)piVar9 + ((ulong)uVar13 - (ulong)uVar26);
        pcVar35 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize = uVar13 + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar26 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar26;
        puVar27 = (ulong *)(source + 2);
        puVar36 = (ulong *)(source + 1);
        uVar25 = uVar26 + 1;
        puVar2 = (ulong *)(piVar4 + -3);
LAB_00107b9f:
        uVar10 = *(ulong *)((long)puVar28 + 1);
        iVar21 = iVar41 << 6;
        do {
          uVar15 = uVar10 * -0x30e4432345000000 >> 0x34;
          uVar22 = *(uint *)((long)LZ4_stream + uVar15 * 4);
          uVar10 = *puVar27;
          *(uint *)((long)LZ4_stream + uVar15 * 4) = uVar25;
          iVar20 = (int)lVar40;
          if (uVar25 <= uVar22 + 0xffff) {
            lVar17 = lVar24;
            if (uVar26 <= uVar22) {
              lVar17 = lVar40;
            }
            if (*(int *)(lVar17 + (ulong)uVar22) == (int)*puVar36) goto LAB_00107c06;
          }
          uVar25 = (int)puVar27 - iVar20;
          puVar16 = (ulong *)((long)(iVar21 >> 6) + (long)puVar27);
          iVar21 = iVar21 + 1;
          puVar36 = puVar27;
          puVar27 = puVar16;
          if (puVar3 < puVar16) goto LAB_00108fc0;
        } while( true );
      }
      iVar43 = 0;
      goto LAB_00109212;
    }
    if (0x7e000000 < (uint)inputSize) goto LAB_00107a9f;
    uVar26 = (LZ4_stream->internal_donotuse).currentOffset;
    piVar9 = (int *)__src->dictionary;
    uVar13 = __src->dictSize;
    uVar25 = __src->currentOffset;
    LZ4_stream->table[0x802] = 0;
    pcVar35 = dest + maxOutputSize;
    (LZ4_stream->internal_donotuse).dictSize = inputSize;
    (LZ4_stream->internal_donotuse).currentOffset = uVar26 + inputSize;
    (LZ4_stream->internal_donotuse).tableType = 2;
    if (0xc < (uint)inputSize) {
      lVar40 = (long)source - (ulong)uVar26;
      iVar21 = uVar26 - uVar25;
      puVar3 = (ulong *)((long)piVar4 - 0xb);
      puVar23 = (ulong *)((long)piVar4 - 5);
      lVar24 = (ulong)uVar13 - (ulong)uVar25;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar26;
      puVar27 = (ulong *)(source + 2);
      puVar36 = (ulong *)(source + 1);
      uVar25 = uVar26 + 1;
      puVar2 = (ulong *)(piVar4 + -3);
      local_e0 = dest;
LAB_00107234:
      uVar10 = *(ulong *)((long)puVar28 + 1);
      iVar20 = iVar41 << 6;
      while( true ) {
        uVar15 = uVar10 * -0x30e4432345000000 >> 0x34;
        uVar22 = *(uint *)((long)LZ4_stream + uVar15 * 4);
        if (uVar22 < uVar26) {
          uVar22 = __src->hashTable[uVar15] + iVar21;
          piVar31 = (int *)((long)piVar9 + (ulong)__src->hashTable[uVar15] + lVar24);
          piVar30 = piVar9;
        }
        else {
          piVar31 = (int *)(lVar40 + (ulong)uVar22);
          piVar30 = (int *)source;
        }
        uVar10 = *puVar27;
        *(uint *)((long)LZ4_stream + uVar15 * 4) = uVar25;
        iVar8 = (int)lVar40;
        if ((uVar25 <= uVar22 + 0xffff) && (*piVar31 == (int)*puVar36)) break;
        uVar25 = (int)puVar27 - iVar8;
        puVar16 = (ulong *)((long)(iVar20 >> 6) + (long)puVar27);
        iVar20 = iVar20 + 1;
        puVar36 = puVar27;
        puVar27 = puVar16;
        dest = local_e0;
        if (puVar3 < puVar16) goto LAB_00109094;
      }
      iVar20 = uVar25 - uVar22;
      uVar22 = (int)puVar36 - (int)puVar28;
      lVar17 = 0;
      uVar25 = uVar22 - 0xf;
      cVar7 = (char)puVar36 * '\x10' + (char)puVar28 * -0x10;
      do {
        cVar12 = cVar7;
        uVar44 = uVar25;
        lVar34 = lVar17;
        piVar38 = (int *)((long)piVar31 + lVar34);
        puVar27 = (ulong *)((long)puVar36 + lVar34);
        if ((piVar38 <= piVar30) || (puVar27 <= puVar28)) break;
        lVar17 = lVar34 + -1;
        uVar25 = uVar44 - 1;
        cVar7 = cVar12 + -0x10;
      } while (*(char *)((long)puVar36 + lVar34 + -1) == *(char *)((long)piVar31 + lVar34 + -1));
      iVar6 = (int)lVar34;
      uVar10 = (ulong)(uint)(iVar6 + ((int)puVar36 - (int)puVar28));
      iVar43 = 0;
      if (local_e0 + ((ulong)uVar22 + lVar34 & 0xffffffff) / 0xff + uVar10 + 9 <= pcVar35) {
        puVar36 = (ulong *)(local_e0 + 1);
        if ((uint)((ulong)uVar22 + lVar34) < 0xf) {
          *local_e0 = cVar12;
        }
        else {
          uVar15 = (ulong)(uVar22 - 0xf) + lVar34;
          *local_e0 = -0x10;
          if (0xfe < (int)uVar15) {
            uVar25 = 0x1fd;
            if (uVar44 < 0x1fd) {
              uVar25 = uVar44;
            }
            if (0x1fc < (int)uVar44) {
              uVar44 = 0x1fd;
            }
            memset(puVar36,0xff,(ulong)((((uVar22 + 0xef) - uVar25) + iVar6) / 0xff + 1));
            uVar25 = ((uVar22 + 0xef) - uVar44) + iVar6;
            puVar36 = (ulong *)(local_e0 + (ulong)uVar25 / 0xff + 2);
            uVar15 = (ulong)((uVar22 - 0x10e) + iVar6 + (uVar25 % 0xff - uVar25));
          }
          *(char *)puVar36 = (char)uVar15;
          puVar36 = (ulong *)((long)puVar36 + 1);
        }
        puVar16 = (ulong *)(uVar10 + (long)puVar36);
        do {
          *puVar36 = *puVar28;
          puVar36 = puVar36 + 1;
          puVar28 = puVar28 + 1;
        } while (puVar36 < puVar16);
        do {
          *(short *)puVar16 = (short)iVar20;
          if (piVar30 == piVar9) {
            puVar36 = (ulong *)((long)piVar9 + ((ulong)uVar13 - (long)piVar38) + (long)puVar27);
            if (puVar23 < puVar36) {
              puVar36 = puVar23;
            }
            puVar28 = (ulong *)((long)puVar27 + 4);
            puVar18 = (ulong *)(piVar38 + 1);
            puVar37 = (ulong *)((long)puVar36 - 7);
            puVar19 = puVar28;
            if (puVar28 < puVar37) {
              if (*puVar18 == *puVar28) {
                puVar18 = (ulong *)(piVar38 + 3);
                puVar19 = (ulong *)((long)puVar27 + 0xc);
                goto LAB_0010757d;
              }
              uVar15 = *puVar28 ^ *puVar18;
              uVar10 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar10 = uVar10 >> 3 & 0x1fffffff;
            }
            else {
LAB_0010757d:
              if (puVar19 < puVar37) {
                iVar20 = ((int)puVar19 - (int)puVar27) + -4;
LAB_0010758c:
                if (*puVar18 == *puVar19) goto code_r0x0010759b;
                uVar15 = *puVar19 ^ *puVar18;
                uVar10 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                  }
                }
                uVar10 = (ulong)(((uint)(uVar10 >> 3) & 0x1fffffff) + iVar20);
                goto LAB_00107640;
              }
LAB_001075ac:
              if ((puVar19 < (ulong *)((long)puVar36 - 3U)) && ((int)*puVar18 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar18 = (ulong *)((long)puVar18 + 4);
              }
              if ((puVar19 < (ulong *)((long)puVar36 - 1U)) && ((short)*puVar18 == (short)*puVar19))
              {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar18 = (ulong *)((long)puVar18 + 2);
              }
              if (puVar19 < puVar36) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar18 == (char)*puVar19));
              }
              uVar10 = (ulong)(uint)((int)puVar19 - (int)puVar28);
            }
LAB_00107640:
            uVar25 = (uint)uVar10;
            puVar28 = (ulong *)((long)puVar27 + uVar10 + 4);
            if (puVar28 == puVar36) {
              puVar18 = puVar36;
              puVar37 = (ulong *)source;
              if (puVar36 < puVar2) {
                if (*(ulong *)source == *puVar36) {
                  puVar18 = puVar36 + 1;
                  puVar37 = (ulong *)(source + 8);
                  goto LAB_0010767e;
                }
                uVar15 = *puVar36 ^ *(ulong *)source;
                uVar10 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                  }
                }
                uVar22 = (uint)(uVar10 >> 3) & 0x1fffffff;
              }
              else {
LAB_0010767e:
                if (puVar18 < puVar2) {
                  pcVar39 = (char *)((long)puVar27 + (long)piVar9 + ((ulong)uVar13 - (long)piVar38))
                  ;
                  if (source + (long)inputSize + -5 <= pcVar39) {
                    pcVar39 = source + (long)inputSize + -5;
                  }
                  iVar20 = (int)puVar18 - (int)pcVar39;
LAB_001076a5:
                  if (*puVar37 == *puVar18) goto code_r0x001076b0;
                  uVar15 = *puVar18 ^ *puVar37;
                  uVar10 = 0;
                  if (uVar15 != 0) {
                    for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  uVar22 = ((uint)(uVar10 >> 3) & 0x1fffffff) + iVar20;
                  goto LAB_00107736;
                }
LAB_001076c1:
                if ((puVar18 < piVar4 + -2) && ((int)*puVar37 == (int)*puVar18)) {
                  puVar18 = (ulong *)((long)puVar18 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar37 == (short)*puVar18)
                   ) {
                  puVar18 = (ulong *)((long)puVar18 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar18 < puVar23) {
                  puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar37 == (char)*puVar18));
                }
                uVar22 = (int)puVar18 - (int)puVar36;
              }
LAB_00107736:
              uVar25 = uVar25 + uVar22;
              puVar28 = (ulong *)((long)puVar28 + (ulong)uVar22);
            }
          }
          else {
            puVar28 = (ulong *)((long)puVar27 + 4);
            puVar36 = (ulong *)(piVar38 + 1);
            puVar18 = puVar28;
            if (puVar28 < puVar2) {
              if (*puVar36 == *puVar28) {
                puVar36 = (ulong *)(piVar38 + 3);
                puVar18 = (ulong *)((long)puVar27 + 0xc);
                goto LAB_001074bd;
              }
              uVar15 = *puVar28 ^ *puVar36;
              uVar10 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar10 = uVar10 >> 3 & 0x1fffffff;
            }
            else {
LAB_001074bd:
              if (puVar18 < puVar2) {
                iVar20 = ((int)puVar18 - (int)puVar27) + -4;
LAB_001074ca:
                if (*puVar36 == *puVar18) goto code_r0x001074d9;
                uVar15 = *puVar18 ^ *puVar36;
                uVar10 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                  }
                }
                uVar10 = (ulong)(((uint)(uVar10 >> 3) & 0x1fffffff) + iVar20);
                goto LAB_001075ff;
              }
LAB_001074e9:
              if ((puVar18 < piVar4 + -2) && ((int)*puVar36 == (int)*puVar18)) {
                puVar18 = (ulong *)((long)puVar18 + 4);
                puVar36 = (ulong *)((long)puVar36 + 4);
              }
              if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar36 == (short)*puVar18))
              {
                puVar18 = (ulong *)((long)puVar18 + 2);
                puVar36 = (ulong *)((long)puVar36 + 2);
              }
              if (puVar18 < puVar23) {
                puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar36 == (char)*puVar18));
              }
              uVar10 = (ulong)(uint)((int)puVar18 - (int)puVar28);
            }
LAB_001075ff:
            uVar25 = (uint)uVar10;
            puVar28 = (ulong *)((long)puVar27 + uVar10 + 4);
          }
          iVar43 = 0;
          if (pcVar35 < (char *)((long)puVar16 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) break;
          pcVar39 = (char *)((long)puVar16 + 2);
          if (uVar25 < 0xf) {
            *local_e0 = *local_e0 + (char)uVar25;
            local_e0 = pcVar39;
          }
          else {
            *local_e0 = *local_e0 + '\x0f';
            uVar22 = uVar25 - 0xf;
            pcVar39[0] = -1;
            pcVar39[1] = -1;
            pcVar39[2] = -1;
            pcVar39[3] = -1;
            if (0x3fb < uVar22) {
              uVar22 = (uVar25 - 0x40b) % 0x3fc;
              uVar10 = (ulong)((uVar25 - 0x40b) / 0x3fc << 2);
              memset((char *)((long)puVar16 + 6),0xff,uVar10 + 4);
              pcVar39 = (char *)((long)puVar16 + uVar10 + 6);
            }
            pcVar39[(ushort)((uVar22 & 0xffff) / 0xff)] = (char)((uVar22 & 0xffff) % 0xff);
            local_e0 = pcVar39 + (ushort)((uVar22 & 0xffff) / 0xff) + 1;
          }
          dest = local_e0;
          if (puVar3 <= puVar28) goto LAB_00109094;
          *(int *)((long)LZ4_stream +
                  ((ulong)(*(long *)((long)puVar28 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
               ((int)puVar28 + -2) - iVar8;
          uVar10 = *puVar28 * -0x30e4432345000000 >> 0x34;
          uVar25 = *(uint *)((long)LZ4_stream + uVar10 * 4);
          if (uVar25 < uVar26) {
            uVar25 = iVar21 + __src->hashTable[uVar10];
            piVar38 = (int *)((long)piVar9 + (ulong)__src->hashTable[uVar10] + lVar24);
            piVar30 = piVar9;
          }
          else {
            piVar38 = (int *)(lVar40 + (ulong)uVar25);
            piVar30 = (int *)source;
          }
          uVar22 = (int)puVar28 - iVar8;
          *(uint *)((long)LZ4_stream + uVar10 * 4) = uVar22;
          if ((uVar25 + 0xffff < uVar22) || (*piVar38 != (int)*puVar28)) goto LAB_0010796f;
          puVar16 = (ulong *)(local_e0 + 1);
          *local_e0 = '\0';
          iVar20 = uVar22 - uVar25;
          puVar27 = puVar28;
        } while( true );
      }
      goto LAB_00109212;
    }
LAB_00109094:
    uVar10 = (long)piVar4 - (long)puVar28;
    iVar43 = 0;
    if (pcVar35 < dest + (uVar10 + 0xf0) / 0xff + uVar10 + 1) goto LAB_00109212;
    if (uVar10 < 0xf) {
      *dest = (char)uVar10 << 4;
    }
    else {
      *dest = -0x10;
      pcVar35 = dest;
joined_r0x00109193:
      cVar7 = (char)(uVar10 - 0xf);
      dest = pcVar35 + 1;
      if (0xfe < uVar10 - 0xf) {
        uVar15 = (uVar10 - 0x10e) / 0xff;
        memset(dest,0xff,uVar15 + 1);
        cVar7 = (char)uVar15 + (char)uVar10 + -0xe;
        dest = pcVar35 + uVar15 + 2;
      }
      *dest = cVar7;
    }
LAB_001091e9:
    memcpy(dest + 1,puVar28,uVar10);
    iVar43 = ((int)(dest + 1) + (int)uVar10) - local_98;
  }
LAB_00109212:
  (LZ4_stream->internal_donotuse).dictionary = (uint8_t *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar43;
code_r0x001085dd:
  puVar27 = puVar27 + 1;
  puVar23 = puVar23 + 1;
  iVar20 = iVar20 + 8;
  if (puVar28 <= puVar27) goto LAB_001085ed;
  goto LAB_001085d2;
LAB_0010877a:
  plVar14 = (long *)(lVar40 + 6);
  if (plVar1 < plVar14) goto LAB_001079e6;
  goto LAB_001083c5;
code_r0x001066ae:
  puVar27 = puVar27 + 1;
  puVar23 = puVar23 + 1;
  iVar20 = iVar20 + 8;
  if (puVar28 <= puVar27) goto LAB_001066be;
  goto LAB_001066a3;
LAB_00106856:
  plVar14 = (long *)(lVar40 + 6);
  if (plVar1 < plVar14) goto LAB_001079e6;
  goto LAB_00106484;
LAB_001088d5:
  lVar17 = lVar17 + (ulong)uVar25;
  piVar9 = (int *)source;
  if (uVar25 < uVar13) {
    piVar9 = piVar31;
  }
  iVar20 = uVar26 - uVar25;
  uVar25 = (int)puVar36 - (int)puVar28;
  lVar34 = 0;
  uVar26 = uVar25 - 0xf;
  cVar7 = (char)puVar36 * '\x10' + (char)puVar28 * -0x10;
  do {
    cVar12 = cVar7;
    uVar22 = uVar26;
    lVar33 = lVar34;
    piVar30 = (int *)(lVar17 + lVar33);
    puVar27 = (ulong *)((long)puVar36 + lVar33);
    if ((piVar30 <= piVar9) || (puVar27 <= puVar28)) break;
    lVar34 = lVar33 + -1;
    uVar26 = uVar22 - 1;
    cVar7 = cVar12 + -0x10;
  } while (*(char *)((long)puVar36 + lVar33 + -1) == *(char *)(lVar17 + -1 + lVar33));
  iVar8 = (int)lVar33;
  uVar15 = (ulong)(uint)(iVar8 + ((int)puVar36 - (int)puVar28));
  iVar43 = 0;
  if (local_e8 + ((ulong)uVar25 + lVar33 & 0xffffffff) / 0xff + uVar15 + 9 <= pcVar35) {
    puVar36 = (ulong *)(local_e8 + 1);
    if ((uint)((ulong)uVar25 + lVar33) < 0xf) {
      *local_e8 = cVar12;
    }
    else {
      uVar11 = (ulong)(uVar25 - 0xf) + lVar33;
      *local_e8 = -0x10;
      if (0xfe < (int)uVar11) {
        uVar26 = 0x1fd;
        if (uVar22 < 0x1fd) {
          uVar26 = uVar22;
        }
        if (0x1fc < (int)uVar22) {
          uVar22 = 0x1fd;
        }
        memset(puVar36,0xff,(ulong)((((uVar25 + 0xef) - uVar26) + iVar8) / 0xff + 1));
        uVar26 = ((uVar25 + 0xef) - uVar22) + iVar8;
        puVar36 = (ulong *)(local_e8 + (ulong)uVar26 / 0xff + 2);
        uVar11 = (ulong)((uVar25 - 0x10e) + iVar8 + (uVar26 % 0xff - uVar26));
      }
      *(char *)puVar36 = (char)uVar11;
      puVar36 = (ulong *)((long)puVar36 + 1);
    }
    puVar16 = (ulong *)(uVar15 + (long)puVar36);
    do {
      *puVar36 = *puVar28;
      puVar36 = puVar36 + 1;
      puVar28 = puVar28 + 1;
    } while (puVar36 < puVar16);
    do {
      *(short *)puVar16 = (short)iVar20;
      if (piVar9 == piVar31) {
        puVar36 = (ulong *)((long)piVar31 + (uVar10 - (long)piVar30) + (long)puVar27);
        if (puVar23 < puVar36) {
          puVar36 = puVar23;
        }
        puVar28 = (ulong *)((long)puVar27 + 4);
        puVar37 = (ulong *)(piVar30 + 1);
        puVar18 = (ulong *)((long)puVar36 - 7);
        puVar19 = puVar28;
        if (puVar28 < puVar18) {
          if (*puVar37 == *puVar28) {
            puVar37 = (ulong *)(piVar30 + 3);
            puVar19 = (ulong *)((long)puVar27 + 0xc);
            goto LAB_00108ba8;
          }
          uVar11 = *puVar28 ^ *puVar37;
          uVar15 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar15 = uVar15 >> 3 & 0x1fffffff;
        }
        else {
LAB_00108ba8:
          if (puVar19 < puVar18) {
            iVar20 = ((int)puVar19 - (int)puVar27) + -4;
LAB_00108bb7:
            if (*puVar37 == *puVar19) goto code_r0x00108bc6;
            uVar11 = *puVar19 ^ *puVar37;
            uVar15 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (ulong)(((uint)(uVar15 >> 3) & 0x1fffffff) + iVar20);
            goto LAB_00108c6b;
          }
LAB_00108bd7:
          if ((puVar19 < (ulong *)((long)puVar36 - 3U)) && ((int)*puVar37 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar36 - 1U)) && ((short)*puVar37 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar19 < puVar36) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar37 == (char)*puVar19));
          }
          uVar15 = (ulong)(uint)((int)puVar19 - (int)puVar28);
        }
LAB_00108c6b:
        uVar26 = (uint)uVar15;
        puVar28 = (ulong *)((long)puVar27 + uVar15 + 4);
        if (puVar28 == puVar36) {
          puVar18 = puVar36;
          puVar37 = (ulong *)source;
          if (puVar36 < puVar2) {
            if (*(ulong *)source == *puVar36) {
              puVar18 = puVar36 + 1;
              puVar37 = (ulong *)(source + 8);
              goto LAB_00108ca7;
            }
            uVar11 = *puVar36 ^ *(ulong *)source;
            uVar15 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar25 = (uint)(uVar15 >> 3) & 0x1fffffff;
          }
          else {
LAB_00108ca7:
            if (puVar18 < puVar2) {
              pcVar39 = (char *)((long)puVar27 + (long)piVar31 + (uVar10 - (long)piVar30));
              if (source + (long)inputSize + -5 <= pcVar39) {
                pcVar39 = source + (long)inputSize + -5;
              }
              iVar20 = (int)puVar18 - (int)pcVar39;
LAB_00108cc9:
              if (*puVar37 == *puVar18) goto code_r0x00108cd4;
              uVar11 = *puVar18 ^ *puVar37;
              uVar15 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar25 = ((uint)(uVar15 >> 3) & 0x1fffffff) + iVar20;
              goto LAB_00108d5a;
            }
LAB_00108ce5:
            if ((puVar18 < piVar4 + -2) && ((int)*puVar37 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar37 = (ulong *)((long)puVar37 + 4);
            }
            if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar37 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar37 = (ulong *)((long)puVar37 + 2);
            }
            if (puVar18 < puVar23) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar37 == (char)*puVar18));
            }
            uVar25 = (int)puVar18 - (int)puVar36;
          }
LAB_00108d5a:
          uVar26 = uVar26 + uVar25;
          puVar28 = (ulong *)((long)puVar28 + (ulong)uVar25);
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar27 + 4);
        puVar36 = (ulong *)(piVar30 + 1);
        puVar18 = puVar28;
        if (puVar28 < puVar2) {
          if (*puVar36 == *puVar28) {
            puVar36 = (ulong *)(piVar30 + 3);
            puVar18 = (ulong *)((long)puVar27 + 0xc);
            goto LAB_00108af0;
          }
          uVar11 = *puVar28 ^ *puVar36;
          uVar15 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar15 = uVar15 >> 3 & 0x1fffffff;
        }
        else {
LAB_00108af0:
          if (puVar18 < puVar2) {
            iVar20 = ((int)puVar18 - (int)puVar27) + -4;
LAB_00108afd:
            if (*puVar36 == *puVar18) goto code_r0x00108b0c;
            uVar11 = *puVar18 ^ *puVar36;
            uVar15 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (ulong)(((uint)(uVar15 >> 3) & 0x1fffffff) + iVar20);
            goto LAB_00108c2a;
          }
LAB_00108b1c:
          if ((puVar18 < piVar4 + -2) && ((int)*puVar36 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar36 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar18 < puVar23) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar36 == (char)*puVar18));
          }
          uVar15 = (ulong)(uint)((int)puVar18 - (int)puVar28);
        }
LAB_00108c2a:
        uVar26 = (uint)uVar15;
        puVar28 = (ulong *)((long)puVar27 + uVar15 + 4);
      }
      iVar43 = 0;
      if (pcVar35 < (char *)((long)puVar16 + (ulong)(uVar26 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar16 + 2);
      if (uVar26 < 0xf) {
        *local_e8 = *local_e8 + (char)uVar26;
      }
      else {
        *local_e8 = *local_e8 + '\x0f';
        uVar25 = uVar26 - 0xf;
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        if (0x3fb < uVar25) {
          uVar25 = (uVar26 - 0x40b) % 0x3fc;
          uVar15 = (ulong)((uVar26 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar16 + 6),0xff,uVar15 + 4);
          dest = (char *)((long)puVar16 + uVar15 + 6);
        }
        pcVar39 = dest + (ushort)((uVar25 & 0xffff) / 0xff);
        dest = pcVar39 + 1;
        *pcVar39 = (char)((uVar25 & 0xffff) % 0xff);
      }
      if (puVar3 <= puVar28) goto LAB_001082aa;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar28 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar28 + -2) - iVar21;
      uVar15 = *puVar28 * -0x30e4432345000000 >> 0x34;
      uVar25 = (int)puVar28 - iVar21;
      uVar26 = *(uint *)((long)LZ4_stream + uVar15 * 4);
      piVar9 = (int *)source;
      lVar17 = lVar40;
      if (uVar26 < uVar13) {
        piVar9 = piVar31;
        lVar17 = lVar24;
      }
      *(uint *)((long)LZ4_stream + uVar15 * 4) = uVar25;
      local_e8 = dest;
      if ((uVar26 + 0xffff < uVar25) ||
         (piVar30 = (int *)(lVar17 + (ulong)uVar26), *piVar30 != (int)*puVar28)) goto LAB_00108f61;
      puVar16 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar20 = uVar25 - uVar26;
      puVar27 = puVar28;
    } while( true );
  }
  goto LAB_00109212;
code_r0x00108bc6:
  puVar19 = puVar19 + 1;
  puVar37 = puVar37 + 1;
  iVar20 = iVar20 + 8;
  if (puVar18 <= puVar19) goto LAB_00108bd7;
  goto LAB_00108bb7;
code_r0x00108cd4:
  puVar18 = puVar18 + 1;
  puVar37 = puVar37 + 1;
  iVar20 = iVar20 + 8;
  if (puVar2 <= puVar18) goto LAB_00108ce5;
  goto LAB_00108cc9;
code_r0x00108b0c:
  puVar18 = puVar18 + 1;
  puVar36 = puVar36 + 1;
  iVar20 = iVar20 + 8;
  if (puVar2 <= puVar18) goto LAB_00108b1c;
  goto LAB_00108afd;
LAB_00108f61:
  puVar36 = (ulong *)((long)puVar28 + 1);
  uVar26 = (int)puVar36 - iVar21;
  puVar27 = (ulong *)((long)puVar28 + 2);
  if (puVar3 < puVar27) goto LAB_001082aa;
  goto LAB_00108870;
LAB_00106a12:
  lVar17 = lVar17 + (ulong)uVar22;
  piVar9 = (int *)source;
  if (uVar22 < uVar13) {
    piVar9 = piVar31;
  }
  iVar20 = uVar25 - uVar22;
  uVar22 = (int)puVar36 - (int)puVar28;
  lVar34 = 0;
  uVar25 = uVar22 - 0xf;
  cVar7 = (char)puVar36 * '\x10' + (char)puVar28 * -0x10;
  do {
    cVar12 = cVar7;
    uVar44 = uVar25;
    lVar33 = lVar34;
    piVar30 = (int *)(lVar17 + lVar33);
    puVar27 = (ulong *)((long)puVar36 + lVar33);
    if ((piVar30 <= piVar9) || (puVar27 <= puVar28)) break;
    lVar34 = lVar33 + -1;
    uVar25 = uVar44 - 1;
    cVar7 = cVar12 + -0x10;
  } while (*(char *)((long)puVar36 + lVar33 + -1) == *(char *)(lVar17 + -1 + lVar33));
  iVar8 = (int)lVar33;
  uVar15 = (ulong)(uint)(iVar8 + ((int)puVar36 - (int)puVar28));
  iVar43 = 0;
  if (local_e8 + ((ulong)uVar22 + lVar33 & 0xffffffff) / 0xff + uVar15 + 9 <= pcVar35) {
    puVar36 = (ulong *)(local_e8 + 1);
    if ((uint)((ulong)uVar22 + lVar33) < 0xf) {
      *local_e8 = cVar12;
    }
    else {
      uVar11 = (ulong)(uVar22 - 0xf) + lVar33;
      *local_e8 = -0x10;
      if (0xfe < (int)uVar11) {
        uVar25 = 0x1fd;
        if (uVar44 < 0x1fd) {
          uVar25 = uVar44;
        }
        if (0x1fc < (int)uVar44) {
          uVar44 = 0x1fd;
        }
        memset(puVar36,0xff,(ulong)((((uVar22 + 0xef) - uVar25) + iVar8) / 0xff + 1));
        uVar25 = ((uVar22 + 0xef) - uVar44) + iVar8;
        puVar36 = (ulong *)(local_e8 + (ulong)uVar25 / 0xff + 2);
        uVar11 = (ulong)((uVar22 - 0x10e) + iVar8 + (uVar25 % 0xff - uVar25));
      }
      *(char *)puVar36 = (char)uVar11;
      puVar36 = (ulong *)((long)puVar36 + 1);
    }
    puVar16 = (ulong *)(uVar15 + (long)puVar36);
    do {
      *puVar36 = *puVar28;
      puVar36 = puVar36 + 1;
      puVar28 = puVar28 + 1;
    } while (puVar36 < puVar16);
    do {
      *(short *)puVar16 = (short)iVar20;
      if (piVar9 == piVar31) {
        puVar36 = (ulong *)((long)piVar31 + (uVar10 - (long)piVar30) + (long)puVar27);
        if (puVar23 < puVar36) {
          puVar36 = puVar23;
        }
        puVar28 = (ulong *)((long)puVar27 + 4);
        puVar37 = (ulong *)(piVar30 + 1);
        puVar18 = (ulong *)((long)puVar36 - 7);
        puVar19 = puVar28;
        if (puVar28 < puVar18) {
          if (*puVar37 == *puVar28) {
            puVar37 = (ulong *)(piVar30 + 3);
            puVar19 = (ulong *)((long)puVar27 + 0xc);
            goto LAB_00106cf7;
          }
          uVar11 = *puVar28 ^ *puVar37;
          uVar15 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar15 = uVar15 >> 3 & 0x1fffffff;
        }
        else {
LAB_00106cf7:
          if (puVar19 < puVar18) {
            iVar20 = ((int)puVar19 - (int)puVar27) + -4;
LAB_00106d06:
            if (*puVar37 == *puVar19) goto code_r0x00106d15;
            uVar11 = *puVar19 ^ *puVar37;
            uVar15 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (ulong)(((uint)(uVar15 >> 3) & 0x1fffffff) + iVar20);
            goto LAB_00106dba;
          }
LAB_00106d26:
          if ((puVar19 < (ulong *)((long)puVar36 - 3U)) && ((int)*puVar37 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar36 - 1U)) && ((short)*puVar37 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar19 < puVar36) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar37 == (char)*puVar19));
          }
          uVar15 = (ulong)(uint)((int)puVar19 - (int)puVar28);
        }
LAB_00106dba:
        uVar25 = (uint)uVar15;
        puVar28 = (ulong *)((long)puVar27 + uVar15 + 4);
        if (puVar28 == puVar36) {
          puVar18 = puVar36;
          puVar37 = (ulong *)source;
          if (puVar36 < puVar2) {
            if (*(ulong *)source == *puVar36) {
              puVar18 = puVar36 + 1;
              puVar37 = (ulong *)(source + 8);
              goto LAB_00106df6;
            }
            uVar11 = *puVar36 ^ *(ulong *)source;
            uVar15 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar22 = (uint)(uVar15 >> 3) & 0x1fffffff;
          }
          else {
LAB_00106df6:
            if (puVar18 < puVar2) {
              pcVar39 = (char *)((long)puVar27 + (long)piVar31 + (uVar10 - (long)piVar30));
              if (source + (long)inputSize + -5 <= pcVar39) {
                pcVar39 = source + (long)inputSize + -5;
              }
              iVar20 = (int)puVar18 - (int)pcVar39;
LAB_00106e18:
              if (*puVar37 == *puVar18) goto code_r0x00106e23;
              uVar11 = *puVar18 ^ *puVar37;
              uVar15 = 0;
              if (uVar11 != 0) {
                for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar22 = ((uint)(uVar15 >> 3) & 0x1fffffff) + iVar20;
              goto LAB_00106ea9;
            }
LAB_00106e34:
            if ((puVar18 < piVar4 + -2) && ((int)*puVar37 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar37 = (ulong *)((long)puVar37 + 4);
            }
            if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar37 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar37 = (ulong *)((long)puVar37 + 2);
            }
            if (puVar18 < puVar23) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar37 == (char)*puVar18));
            }
            uVar22 = (int)puVar18 - (int)puVar36;
          }
LAB_00106ea9:
          uVar25 = uVar25 + uVar22;
          puVar28 = (ulong *)((long)puVar28 + (ulong)uVar22);
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar27 + 4);
        puVar36 = (ulong *)(piVar30 + 1);
        puVar18 = puVar28;
        if (puVar28 < puVar2) {
          if (*puVar36 == *puVar28) {
            puVar36 = (ulong *)(piVar30 + 3);
            puVar18 = (ulong *)((long)puVar27 + 0xc);
            goto LAB_00106c3f;
          }
          uVar11 = *puVar28 ^ *puVar36;
          uVar15 = 0;
          if (uVar11 != 0) {
            for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar15 = uVar15 >> 3 & 0x1fffffff;
        }
        else {
LAB_00106c3f:
          if (puVar18 < puVar2) {
            iVar20 = ((int)puVar18 - (int)puVar27) + -4;
LAB_00106c4c:
            if (*puVar36 == *puVar18) goto code_r0x00106c5b;
            uVar11 = *puVar18 ^ *puVar36;
            uVar15 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (ulong)(((uint)(uVar15 >> 3) & 0x1fffffff) + iVar20);
            goto LAB_00106d79;
          }
LAB_00106c6b:
          if ((puVar18 < piVar4 + -2) && ((int)*puVar36 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar36 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar18 < puVar23) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar36 == (char)*puVar18));
          }
          uVar15 = (ulong)(uint)((int)puVar18 - (int)puVar28);
        }
LAB_00106d79:
        uVar25 = (uint)uVar15;
        puVar28 = (ulong *)((long)puVar27 + uVar15 + 4);
      }
      iVar43 = 0;
      if (pcVar35 < (char *)((long)puVar16 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar16 + 2);
      if (uVar25 < 0xf) {
        *local_e8 = *local_e8 + (char)uVar25;
      }
      else {
        *local_e8 = *local_e8 + '\x0f';
        uVar22 = uVar25 - 0xf;
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        if (0x3fb < uVar22) {
          uVar22 = (uVar25 - 0x40b) % 0x3fc;
          uVar15 = (ulong)((uVar25 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar16 + 6),0xff,uVar15 + 4);
          dest = (char *)((long)puVar16 + uVar15 + 6);
        }
        pcVar39 = dest + (ushort)((uVar22 & 0xffff) / 0xff);
        dest = pcVar39 + 1;
        *pcVar39 = (char)((uVar22 & 0xffff) % 0xff);
      }
      if (puVar3 <= puVar28) goto LAB_0010913e;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar28 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar28 + -2) - iVar21;
      uVar15 = *puVar28 * -0x30e4432345000000 >> 0x34;
      uVar22 = (int)puVar28 - iVar21;
      uVar25 = *(uint *)((long)LZ4_stream + uVar15 * 4);
      piVar9 = (int *)source;
      lVar17 = lVar40;
      if (uVar25 < uVar13) {
        piVar9 = piVar31;
        lVar17 = lVar24;
      }
      *(uint *)((long)LZ4_stream + uVar15 * 4) = uVar22;
      local_e8 = dest;
      if (((uVar25 < uVar13 - uVar26) || (uVar25 + 0xffff < uVar22)) ||
         (piVar30 = (int *)(lVar17 + (ulong)uVar25), *piVar30 != (int)*puVar28)) goto LAB_001070bc;
      puVar16 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar20 = uVar22 - uVar25;
      puVar27 = puVar28;
    } while( true );
  }
  goto LAB_00109212;
code_r0x00106d15:
  puVar19 = puVar19 + 1;
  puVar37 = puVar37 + 1;
  iVar20 = iVar20 + 8;
  if (puVar18 <= puVar19) goto LAB_00106d26;
  goto LAB_00106d06;
code_r0x00106e23:
  puVar18 = puVar18 + 1;
  puVar37 = puVar37 + 1;
  iVar20 = iVar20 + 8;
  if (puVar2 <= puVar18) goto LAB_00106e34;
  goto LAB_00106e18;
code_r0x00106c5b:
  puVar18 = puVar18 + 1;
  puVar36 = puVar36 + 1;
  iVar20 = iVar20 + 8;
  if (puVar2 <= puVar18) goto LAB_00106c6b;
  goto LAB_00106c4c;
LAB_001070bc:
  puVar36 = (ulong *)((long)puVar28 + 1);
  uVar25 = (int)puVar36 - iVar21;
  puVar27 = (ulong *)((long)puVar28 + 2);
  if (puVar3 < puVar27) goto LAB_0010913e;
  goto LAB_001069a7;
LAB_00107c06:
  lVar17 = lVar17 + (ulong)uVar22;
  piVar31 = (int *)source;
  if (uVar22 < uVar26) {
    piVar31 = piVar9;
  }
  iVar21 = uVar25 - uVar22;
  uVar22 = (int)puVar36 - (int)puVar28;
  lVar34 = 0;
  uVar25 = uVar22 - 0xf;
  cVar7 = (char)puVar36 * '\x10' + (char)puVar28 * -0x10;
  do {
    cVar12 = cVar7;
    uVar44 = uVar25;
    lVar33 = lVar34;
    piVar30 = (int *)(lVar17 + lVar33);
    puVar27 = (ulong *)((long)puVar36 + lVar33);
    if ((piVar30 <= piVar31) || (puVar27 <= puVar28)) break;
    lVar34 = lVar33 + -1;
    uVar25 = uVar44 - 1;
    cVar7 = cVar12 + -0x10;
  } while (*(char *)((long)puVar36 + lVar33 + -1) == *(char *)(lVar17 + -1 + lVar33));
  iVar8 = (int)lVar33;
  uVar10 = (ulong)(uint)(iVar8 + ((int)puVar36 - (int)puVar28));
  iVar43 = 0;
  if (dest + ((ulong)uVar22 + lVar33 & 0xffffffff) / 0xff + uVar10 + 9 <= pcVar35) {
    puVar36 = (ulong *)(dest + 1);
    if ((uint)((ulong)uVar22 + lVar33) < 0xf) {
      *dest = cVar12;
    }
    else {
      uVar15 = (ulong)(uVar22 - 0xf) + lVar33;
      *dest = -0x10;
      if (0xfe < (int)uVar15) {
        uVar25 = 0x1fd;
        if (uVar44 < 0x1fd) {
          uVar25 = uVar44;
        }
        if (0x1fc < (int)uVar44) {
          uVar44 = 0x1fd;
        }
        memset(puVar36,0xff,(ulong)((((uVar22 + 0xef) - uVar25) + iVar8) / 0xff + 1));
        uVar25 = ((uVar22 + 0xef) - uVar44) + iVar8;
        puVar36 = (ulong *)(dest + (ulong)uVar25 / 0xff + 2);
        uVar15 = (ulong)((uVar22 - 0x10e) + iVar8 + (uVar25 % 0xff - uVar25));
      }
      *(char *)puVar36 = (char)uVar15;
      puVar36 = (ulong *)((long)puVar36 + 1);
    }
    puVar16 = (ulong *)(uVar10 + (long)puVar36);
    do {
      *puVar36 = *puVar28;
      puVar36 = puVar36 + 1;
      puVar28 = puVar28 + 1;
    } while (puVar36 < puVar16);
    do {
      *(short *)puVar16 = (short)iVar21;
      if (piVar31 == piVar9) {
        puVar36 = (ulong *)((long)piVar9 + ((ulong)uVar13 - (long)piVar30) + (long)puVar27);
        if (puVar23 < puVar36) {
          puVar36 = puVar23;
        }
        puVar28 = (ulong *)((long)puVar27 + 4);
        puVar37 = (ulong *)(piVar30 + 1);
        puVar18 = (ulong *)((long)puVar36 - 7);
        puVar19 = puVar28;
        if (puVar28 < puVar18) {
          if (*puVar37 == *puVar28) {
            puVar37 = (ulong *)(piVar30 + 3);
            puVar19 = (ulong *)((long)puVar27 + 0xc);
            goto LAB_00107ec4;
          }
          uVar10 = *puVar28 ^ *puVar37;
          lVar17 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          uVar25 = (uint)lVar17 >> 3;
        }
        else {
LAB_00107ec4:
          if (puVar19 < puVar18) {
            iVar21 = ((int)puVar19 - (int)puVar27) + -4;
LAB_00107ed6:
            if (*puVar37 == *puVar19) goto code_r0x00107ee1;
            uVar15 = *puVar19 ^ *puVar37;
            uVar10 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar25 = ((uint)(uVar10 >> 3) & 0x1fffffff) + iVar21;
            goto LAB_00107f7b;
          }
LAB_00107ef2:
          if ((puVar19 < (ulong *)((long)puVar36 - 3U)) && ((int)*puVar37 == (int)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 4);
            puVar37 = (ulong *)((long)puVar37 + 4);
          }
          if ((puVar19 < (ulong *)((long)puVar36 - 1U)) && ((short)*puVar37 == (short)*puVar19)) {
            puVar19 = (ulong *)((long)puVar19 + 2);
            puVar37 = (ulong *)((long)puVar37 + 2);
          }
          if (puVar19 < puVar36) {
            puVar19 = (ulong *)((long)puVar19 + (ulong)((char)*puVar37 == (char)*puVar19));
          }
          uVar25 = (int)puVar19 - (int)puVar28;
        }
LAB_00107f7b:
        puVar28 = (ulong *)((long)puVar27 + (ulong)uVar25 + 4);
        if (puVar28 == puVar36) {
          puVar18 = puVar36;
          puVar37 = (ulong *)source;
          if (puVar36 < puVar2) {
            if (*(ulong *)source == *puVar36) {
              puVar18 = puVar36 + 1;
              puVar37 = (ulong *)(source + 8);
              goto LAB_00107fb7;
            }
            uVar15 = *puVar36 ^ *(ulong *)source;
            uVar10 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar22 = (uint)(uVar10 >> 3) & 0x1fffffff;
          }
          else {
LAB_00107fb7:
            if (puVar18 < puVar2) {
              pcVar39 = (char *)((long)puVar27 + (long)piVar9 + ((ulong)uVar13 - (long)piVar30));
              if (source + (long)inputSize + -5 <= pcVar39) {
                pcVar39 = source + (long)inputSize + -5;
              }
              iVar21 = (int)puVar18 - (int)pcVar39;
LAB_00107fdc:
              if (*puVar37 == *puVar18) goto code_r0x00107fe7;
              uVar15 = *puVar18 ^ *puVar37;
              uVar10 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              uVar22 = ((uint)(uVar10 >> 3) & 0x1fffffff) + iVar21;
              goto LAB_0010806b;
            }
LAB_00107ff8:
            if ((puVar18 < piVar4 + -2) && ((int)*puVar37 == (int)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 4);
              puVar37 = (ulong *)((long)puVar37 + 4);
            }
            if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar37 == (short)*puVar18)) {
              puVar18 = (ulong *)((long)puVar18 + 2);
              puVar37 = (ulong *)((long)puVar37 + 2);
            }
            if (puVar18 < puVar23) {
              puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar37 == (char)*puVar18));
            }
            uVar22 = (int)puVar18 - (int)puVar36;
          }
LAB_0010806b:
          uVar25 = uVar25 + uVar22;
          puVar28 = (ulong *)((long)puVar28 + (ulong)uVar22);
        }
      }
      else {
        puVar28 = (ulong *)((long)puVar27 + 4);
        puVar36 = (ulong *)(piVar30 + 1);
        puVar18 = puVar28;
        if (puVar28 < puVar2) {
          if (*puVar36 == *puVar28) {
            puVar36 = (ulong *)(piVar30 + 3);
            puVar18 = (ulong *)((long)puVar27 + 0xc);
            goto LAB_00107df8;
          }
          uVar10 = *puVar28 ^ *puVar36;
          lVar17 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
            }
          }
          uVar25 = (uint)lVar17 >> 3;
        }
        else {
LAB_00107df8:
          if (puVar18 < puVar2) {
            iVar21 = ((int)puVar18 - (int)puVar27) + -4;
LAB_00107e08:
            if (*puVar36 == *puVar18) goto code_r0x00107e17;
            uVar15 = *puVar18 ^ *puVar36;
            uVar10 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            uVar25 = ((uint)(uVar10 >> 3) & 0x1fffffff) + iVar21;
            goto LAB_00107f3c;
          }
LAB_00107e27:
          if ((puVar18 < piVar4 + -2) && ((int)*puVar36 == (int)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 4);
            puVar36 = (ulong *)((long)puVar36 + 4);
          }
          if ((puVar18 < (ulong *)((long)piVar4 - 6U)) && ((short)*puVar36 == (short)*puVar18)) {
            puVar18 = (ulong *)((long)puVar18 + 2);
            puVar36 = (ulong *)((long)puVar36 + 2);
          }
          if (puVar18 < puVar23) {
            puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar36 == (char)*puVar18));
          }
          uVar25 = (int)puVar18 - (int)puVar28;
        }
LAB_00107f3c:
        puVar28 = (ulong *)((long)puVar27 + (ulong)uVar25 + 4);
      }
      iVar43 = 0;
      if (pcVar35 < (char *)((long)puVar16 + (ulong)(uVar25 + 0xf0) / 0xff + 8)) break;
      pcVar39 = (char *)((long)puVar16 + 2);
      if (uVar25 < 0xf) {
        *dest = *dest + (char)uVar25;
        dest = pcVar39;
      }
      else {
        *dest = *dest + '\x0f';
        uVar29 = (ushort)(uVar25 - 0xf);
        pcVar39[0] = -1;
        pcVar39[1] = -1;
        pcVar39[2] = -1;
        pcVar39[3] = -1;
        if (0x3fb < uVar25 - 0xf) {
          uVar29 = (ushort)((ulong)(uVar25 - 0x40b) % 0x3fc);
          uVar10 = (ulong)((uVar25 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)puVar16 + 6),0xff,uVar10 + 4);
          pcVar39 = (char *)((long)puVar16 + uVar10 + 6);
        }
        pcVar39[uVar29 / 0xff] = (char)(uVar29 % 0xff);
        dest = pcVar39 + uVar29 / 0xff + 1;
      }
      if (puVar3 <= puVar28) goto LAB_00108fc0;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar28 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar28 + -2) - iVar20;
      uVar10 = *puVar28 * -0x30e4432345000000 >> 0x34;
      uVar22 = (int)puVar28 - iVar20;
      uVar25 = *(uint *)((long)LZ4_stream + uVar10 * 4);
      piVar31 = (int *)source;
      lVar17 = lVar40;
      if (uVar25 < uVar26) {
        piVar31 = piVar9;
        lVar17 = lVar24;
      }
      *(uint *)((long)LZ4_stream + uVar10 * 4) = uVar22;
      if ((uVar25 + 0xffff < uVar22) ||
         (piVar30 = (int *)(lVar17 + (ulong)uVar25), *piVar30 != (int)*puVar28)) goto LAB_0010823c;
      puVar16 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar21 = uVar22 - uVar25;
      puVar27 = puVar28;
    } while( true );
  }
  goto LAB_00109212;
code_r0x00107ee1:
  puVar19 = puVar19 + 1;
  puVar37 = puVar37 + 1;
  iVar21 = iVar21 + 8;
  if (puVar18 <= puVar19) goto LAB_00107ef2;
  goto LAB_00107ed6;
code_r0x00107fe7:
  puVar18 = puVar18 + 1;
  puVar37 = puVar37 + 1;
  iVar21 = iVar21 + 8;
  if (puVar2 <= puVar18) goto LAB_00107ff8;
  goto LAB_00107fdc;
code_r0x00107e17:
  puVar18 = puVar18 + 1;
  puVar36 = puVar36 + 1;
  iVar21 = iVar21 + 8;
  if (puVar2 <= puVar18) goto LAB_00107e27;
  goto LAB_00107e08;
LAB_0010823c:
  puVar36 = (ulong *)((long)puVar28 + 1);
  uVar25 = (int)puVar36 - iVar20;
  puVar27 = (ulong *)((long)puVar28 + 2);
  if (puVar3 < puVar27) goto LAB_00108fc0;
  goto LAB_00107b9f;
LAB_00108fc0:
  uVar10 = (long)piVar4 - (long)puVar28;
  iVar43 = 0;
  if (pcVar35 < dest + (uVar10 + 0xf0) / 0xff + uVar10 + 1) goto LAB_00109212;
  if (uVar10 < 0xf) {
    *dest = (char)uVar10 << 4;
  }
  else {
    uVar15 = uVar10 - 0xf;
    *dest = -0x10;
    pcVar35 = dest + 1;
    if (0xfe < uVar15) {
      uVar11 = (uVar10 - 0x10e) / 0xff;
      memset(pcVar35,0xff,uVar11 + 1);
      uVar15 = (uVar11 * -0xff + uVar10) - 0x10e;
      pcVar35 = dest + uVar11 + 2;
    }
    *pcVar35 = (char)uVar15;
    dest = pcVar35;
  }
LAB_00109075:
  memcpy(dest + 1,puVar28,uVar10);
  iVar43 = ((int)(dest + 1) + (int)uVar10) - local_98;
  goto LAB_00109212;
code_r0x0010759b:
  puVar19 = puVar19 + 1;
  puVar18 = puVar18 + 1;
  iVar20 = iVar20 + 8;
  if (puVar37 <= puVar19) goto LAB_001075ac;
  goto LAB_0010758c;
code_r0x001076b0:
  puVar18 = puVar18 + 1;
  puVar37 = puVar37 + 1;
  iVar20 = iVar20 + 8;
  if (puVar2 <= puVar18) goto LAB_001076c1;
  goto LAB_001076a5;
code_r0x001074d9:
  puVar18 = puVar18 + 1;
  puVar36 = puVar36 + 1;
  iVar20 = iVar20 + 8;
  if (puVar2 <= puVar18) goto LAB_001074e9;
  goto LAB_001074ca;
LAB_0010796f:
  puVar36 = (ulong *)((long)puVar28 + 1);
  uVar25 = (int)puVar36 - iVar8;
  puVar27 = (ulong *)((long)puVar28 + 2);
  if (puVar3 < puVar27) goto LAB_00109094;
  goto LAB_00107234;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* streamPtr = &LZ4_stream->internal_donotuse;
    const BYTE* dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i)", inputSize);

    if (streamPtr->dirty) { return 0; } /* Uninitialized structure detected */
    LZ4_renormDictT(streamPtr, inputSize);   /* avoid index overflow */
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize-1 < 4-1)   /* intentional underflow */
      && (dictEnd != (const BYTE*)source) ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = (const BYTE*)source;
    }

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                memcpy(streamPtr, streamPtr->dictCtx, sizeof(LZ4_stream_t));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}